

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O3

LogMessage * __thiscall
google::protobuf::internal::LogMessage::operator<<(LogMessage *this,Status *status)

{
  string local_38;
  
  util::Status::ToString_abi_cxx11_(&local_38,status);
  std::__cxx11::string::_M_append((char *)&this->message_,(ulong)local_38._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return this;
}

Assistant:

LogMessage& LogMessage::operator<<(const util::Status& status) {
  message_ += status.ToString();
  return *this;
}